

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbc.c
# Opt level: O0

Vec_Int_t * Wlc_NtkGetPut(Abc_Ntk_t *pNtk,Gia_Man_t *pGia)

{
  int Entry;
  int iVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  Vec_Int_t *p;
  char *pcVar4;
  Abc_Obj_t *pObj;
  size_t sVar5;
  bool bVar6;
  uint local_74;
  int local_70;
  int Counter;
  int nLits;
  int Value;
  int k;
  int i;
  Vec_Int_t *vFanins;
  char *pSop;
  char *pCube;
  char *pName;
  Abc_Obj_t *pNode;
  Abc_Obj_t *pFanin;
  Abc_Nam_t *pNames;
  Vec_Int_t *vRes;
  int nRegs;
  Gia_Man_t *pGia_local;
  Abc_Ntk_t *pNtk_local;
  
  Entry = Gia_ManRegNum(pGia);
  pNames = (Abc_Nam_t *)0x0;
  iVar1 = Abc_NtkPoNum(pNtk);
  if (iVar1 == 1) {
    iVar1 = Abc_NtkNodeNum(pNtk);
    if (iVar1 == 1) {
      pFanin = (Abc_Obj_t *)0x0;
      pAVar3 = Abc_NtkCo(pNtk,0);
      pAVar3 = Abc_ObjFanin0(pAVar3);
      pSop = (char *)(pAVar3->field_5).pData;
      iVar1 = Abc_ObjFaninNum(pAVar3);
      p = Vec_IntAlloc(iVar1);
      local_74 = 0;
      if (pGia->vNamesIn != (Vec_Ptr_t *)0x0) {
        pFanin = (Abc_Obj_t *)Abc_NamStart(100,0x10);
        for (Value = 0; iVar1 = Vec_PtrSize(pGia->vNamesIn), Value < iVar1; Value = Value + 1) {
          pcVar4 = (char *)Vec_PtrEntry(pGia->vNamesIn,Value);
          Counter = Abc_NamStrFindOrAdd((Abc_Nam_t *)pFanin,pcVar4,(int *)0x0);
          if (Counter != Value + 1) {
            __assert_fail("Value == i+1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcAbc.c"
                          ,0x106,"Vec_Int_t *Wlc_NtkGetPut(Abc_Ntk_t *, Gia_Man_t *)");
          }
        }
      }
      for (Value = 0; iVar1 = Abc_ObjFaninNum(pAVar3), Value < iVar1; Value = Value + 1) {
        pObj = Abc_ObjFanin(pAVar3,Value);
        iVar1 = Abc_ObjIsCi(pObj);
        if (iVar1 == 0) {
          __assert_fail("Abc_ObjIsCi(pFanin)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcAbc.c"
                        ,0x10d,"Vec_Int_t *Wlc_NtkGetPut(Abc_Ntk_t *, Gia_Man_t *)");
        }
        pcVar4 = Abc_ObjName(pObj);
        if (pFanin == (Abc_Obj_t *)0x0) {
          sVar5 = strlen(pcVar4);
          nLits = (int)sVar5;
          do {
            nLits = nLits + -1;
            if ((nLits < 0) || (pcVar4[nLits] < '0')) break;
          } while (pcVar4[nLits] < ':');
          sVar5 = strlen(pcVar4);
          if (nLits == (int)sVar5 + -1) {
            if (local_74 == 0) {
              printf("Cannot read input name \"%s\" of fanin %d.\n",pcVar4,(ulong)(uint)Value);
            }
            Counter = Value;
            local_74 = local_74 + 1;
          }
          else {
            Counter = atoi(pcVar4 + (long)nLits + 1);
          }
        }
        else {
          iVar1 = Abc_NamStrFind((Abc_Nam_t *)pFanin,pcVar4);
          iVar2 = Gia_ManPiNum(pGia);
          Counter = (iVar1 + -1) - iVar2;
          if (Counter < 0) {
            if (local_74 == 0) {
              printf("Cannot read input name \"%s\" of fanin %d.\n",pcVar4,(ulong)(uint)Value);
            }
            Counter = Value;
            local_74 = local_74 + 1;
          }
        }
        Vec_IntPush(p,Counter);
      }
      if (local_74 != 0) {
        printf("Cannot read names for %d inputs of the invariant.\n",(ulong)local_74);
      }
      if (pFanin != (Abc_Obj_t *)0x0) {
        Abc_NamStop((Abc_Nam_t *)pFanin);
      }
      iVar1 = Vec_IntSize(p);
      iVar2 = Abc_ObjFaninNum(pAVar3);
      if (iVar1 != iVar2) {
        __assert_fail("Vec_IntSize(vFanins) == Abc_ObjFaninNum(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcAbc.c"
                      ,0x12d,"Vec_Int_t *Wlc_NtkGetPut(Abc_Ntk_t *, Gia_Man_t *)");
      }
      pNames = (Abc_Nam_t *)Vec_IntAlloc(1000);
      iVar1 = Abc_SopGetCubeNum(pSop);
      Vec_IntPush((Vec_Int_t *)pNames,iVar1);
      for (; *pSop != '\0'; pSop = pSop + (iVar1 + 3)) {
        local_70 = 0;
        nLits = 0;
        while( true ) {
          bVar6 = false;
          if (pSop[nLits] != ' ') {
            Counter = (int)pSop[nLits];
            bVar6 = Counter != 0;
          }
          if (!bVar6) break;
          if (Counter != 0x2d) {
            local_70 = local_70 + 1;
          }
          nLits = nLits + 1;
        }
        Vec_IntPush((Vec_Int_t *)pNames,local_70);
        nLits = 0;
        while( true ) {
          bVar6 = false;
          if (pSop[nLits] != ' ') {
            Counter = (int)pSop[nLits];
            bVar6 = Counter != 0;
          }
          if (!bVar6) break;
          if (Counter != 0x2d) {
            iVar1 = Vec_IntEntry(p,nLits);
            iVar1 = Abc_Var2Lit(iVar1,(uint)(Counter == 0x30));
            Vec_IntPush((Vec_Int_t *)pNames,iVar1);
          }
          nLits = nLits + 1;
        }
        iVar1 = Abc_ObjFaninNum(pAVar3);
      }
      Vec_IntPush((Vec_Int_t *)pNames,Entry);
      Vec_IntFree(p);
    }
    else {
      printf("The number of internal nodes is other than 1.\n");
    }
  }
  else {
    printf("The number of outputs is other than 1.\n");
  }
  return (Vec_Int_t *)pNames;
}

Assistant:

Vec_Int_t * Wlc_NtkGetPut( Abc_Ntk_t * pNtk, Gia_Man_t * pGia )
{
    int nRegs = Gia_ManRegNum(pGia);
    Vec_Int_t * vRes = NULL;
    if ( Abc_NtkPoNum(pNtk) != 1 )
        printf( "The number of outputs is other than 1.\n" );
    else if ( Abc_NtkNodeNum(pNtk) != 1 )
        printf( "The number of internal nodes is other than 1.\n" );
    else
    {
        Abc_Nam_t * pNames = NULL;
        Abc_Obj_t * pFanin, * pNode = Abc_ObjFanin0( Abc_NtkCo(pNtk, 0) );
        char * pName, * pCube, * pSop = (char *)pNode->pData;
        Vec_Int_t * vFanins = Vec_IntAlloc( Abc_ObjFaninNum(pNode) );
        int i, k, Value, nLits, Counter = 0;
        if ( pGia->vNamesIn )
        {
            // hash the names
            pNames = Abc_NamStart( 100, 16 );
            Vec_PtrForEachEntry( char *, pGia->vNamesIn, pName, i )
            {
                Value = Abc_NamStrFindOrAdd( pNames, pName, NULL );
                assert( Value == i+1 );
                //printf( "%s(%d) ", pName, i );
            }
            //printf( "\n" );
        }
        Abc_ObjForEachFanin( pNode, pFanin, i )
        {
            assert( Abc_ObjIsCi(pFanin) );
            pName = Abc_ObjName(pFanin);
            if ( pNames )
            {
                Value = Abc_NamStrFind(pNames, pName) - 1 - Gia_ManPiNum(pGia);
                if ( Value < 0 )
                {
                    if ( Counter++ == 0 )
                        printf( "Cannot read input name \"%s\" of fanin %d.\n", pName, i );
                    Value = i;
                }
            }
            else
            {
                for ( k = (int)strlen(pName)-1; k >= 0; k-- )
                    if ( pName[k] < '0' || pName[k] > '9' )
                        break;
                if ( k == (int)strlen(pName)-1 )
                {
                    if ( Counter++ == 0 )
                        printf( "Cannot read input name \"%s\" of fanin %d.\n", pName, i );
                    Value = i;
                }
                else 
                    Value = atoi(pName + k + 1);
            }
            Vec_IntPush( vFanins, Value );
        }
        if ( Counter )
            printf( "Cannot read names for %d inputs of the invariant.\n", Counter );
        if ( pNames )
            Abc_NamStop( pNames );
        assert( Vec_IntSize(vFanins) == Abc_ObjFaninNum(pNode) );
        vRes = Vec_IntAlloc( 1000 );
        Vec_IntPush( vRes, Abc_SopGetCubeNum(pSop) );
        Abc_SopForEachCube( pSop, Abc_ObjFaninNum(pNode), pCube )
        {
            nLits = 0;
            Abc_CubeForEachVar( pCube, Value, k )
                if ( Value != '-' )
                    nLits++;
            Vec_IntPush( vRes, nLits );
            Abc_CubeForEachVar( pCube, Value, k )
                if ( Value != '-' )
                    Vec_IntPush( vRes, Abc_Var2Lit(Vec_IntEntry(vFanins, k), (int)Value == '0') );
        }
        Vec_IntPush( vRes, nRegs );
        Vec_IntFree( vFanins );
    }
    return vRes;
}